

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::
Table<kj::_::(anonymous_namespace)::SiPair,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
::Impl<0UL,_false>::insert
          (Impl<0UL,_false> *this,
          Table<kj::_::(anonymous_namespace)::SiPair,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
          *table,size_t pos,SiPair *row,uint skip)

{
  size_t *psVar1;
  uint uVar2;
  SiPair *pSVar3;
  StringHasher *this_00;
  char *pcVar4;
  ulong uVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_01;
  size_t sVar12;
  HashBucket *pHVar13;
  HashBucket *s;
  HashBucket *pHVar14;
  Maybe<unsigned_long> MVar15;
  StringPtr str;
  bool success;
  undefined7 uStack_97;
  char *local_90;
  InsertionOrderIndex *local_88;
  size_t local_80;
  SiPair *local_78;
  size_t pos_local;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_table_h:478:5)>
  local_68;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar11;
  
  pos_local = pos;
  if (skip != 0) {
    pSVar3 = (table->rows).builder.ptr;
    lVar9 = ((long)(table->rows).builder.pos - (long)pSVar3) / 0x18;
    this_00 = (StringHasher *)(row->str).content.ptr;
    pcVar4 = (char *)(row->str).content.size_;
    uVar5 = (table->indexes).impl.
            super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
            .value.buckets.size_ * 2;
    uVar10 = ((table->indexes).impl.
              super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
              .value.erasedCount + lVar9) * 3 + 3;
    local_80 = pos;
    local_78 = row;
    if (uVar5 < uVar10) {
      uVar10 = lVar9 * 2 + 2;
      if (uVar10 < uVar5) {
        uVar10 = uVar5;
      }
      HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>::rehash
                ((HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher> *)&table->indexes,
                 uVar10);
      uVar10 = extraout_RDX;
    }
    str.content.size_ = uVar10;
    str.content.ptr = pcVar4;
    local_88 = (InsertionOrderIndex *)&table->indexes;
    uVar7 = _::anon_unknown_0::StringHasher::hashCode(this_00,str);
    uVar8 = _::chooseBucket(uVar7,(uint)(table->indexes).impl.
                                        super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
                                        .value.buckets.size_);
    pHVar14 = (HashBucket *)0x0;
LAB_00155e92:
    pHVar13 = (table->indexes).impl.
              super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
              .value.buckets.ptr + uVar8;
    uVar2 = pHVar13->value;
    if (uVar2 == 1) {
      if (pHVar14 == (HashBucket *)0x0) {
        pHVar14 = pHVar13;
      }
    }
    else {
      if (uVar2 == 0) {
        if (pHVar14 != (HashBucket *)0x0) {
          psVar1 = &(table->indexes).impl.
                    super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
                    .value.erasedCount;
          *psVar1 = *psVar1 - 1;
          pHVar13 = pHVar14;
        }
        *pHVar13 = (HashBucket)(((ulong)uVar7 | local_80 << 0x20) + 0x200000000);
        _success = (StringHasher *)((ulong)_success & 0xffffffffffffff00);
        local_68.func.success = &success;
        local_68.func.indexObj = local_88;
        local_68.func.pos = &pos_local;
        local_68.func.row = &local_78->str;
        local_68.canceled = false;
        local_68.func.table = (Table<unsigned_int,_kj::InsertionOrderIndex> *)table;
        Impl<1UL,_false>::insert((Impl<1UL,_false> *)this,table,pos_local,local_78,skip);
        _success = (StringHasher *)(CONCAT71(uStack_97,*this) ^ 1);
        _::
        Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.h:478:5)>
        ::~Deferred(&local_68);
        aVar11 = extraout_RDX_01;
        goto LAB_00155fbf;
      }
      if (pHVar13->hash == uVar7) {
        local_68.func.table = *(Table<unsigned_int,_kj::InsertionOrderIndex> **)&pSVar3[uVar2 - 2].i
        ;
        local_68.func.success = (bool *)pSVar3[uVar2 - 2].str.content.ptr;
        local_68.func.indexObj = (InsertionOrderIndex *)pSVar3[uVar2 - 2].str.content.size_;
        _success = this_00;
        local_90 = pcVar4;
        bVar6 = StringPtr::operator==((StringPtr *)&local_68,(StringPtr *)&success);
        if (bVar6) goto LAB_00155fab;
      }
    }
    sVar12 = (ulong)uVar8 + 1;
    uVar8 = 0;
    if (sVar12 != (table->indexes).impl.
                  super_TupleElement<0U,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>_>
                  .value.buckets.size_) {
      uVar8 = (uint)sVar12;
    }
    goto LAB_00155e92;
  }
  MVar15 = Impl<1UL,_false>::insert((Impl<1UL,_false> *)this,table,pos,row,0);
  aVar11 = MVar15.ptr.field_1;
LAB_00155fbf:
  MVar15.ptr.field_1.value = aVar11.value;
  MVar15.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar15.ptr;
LAB_00155fab:
  uVar7 = pHVar13->value;
  *this = (Impl<0UL,_false>)0x1;
  *(ulong *)(this + 8) = (ulong)(uVar7 - 2);
  aVar11 = extraout_RDX_00;
  goto LAB_00155fbf;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_MAYBE(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return *existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == nullptr;
    return result;
  }